

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

void __thiscall
QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate(QDtlsClientVerifierPrivate *this)

{
  DtlsCookieVerifier *pDVar1;
  QTlsBackend *pQVar2;
  DtlsCookieVerifier *pDVar3;
  QLoggingCategory *pQVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QDebug local_50;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QDtlsClientVerifierPrivate_002d0108;
  (this->backend)._M_t.
  super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
  .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl =
       (DtlsCookieVerifier *)0x0;
  pQVar2 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar2 == (QTlsBackend *)0x0) {
    pQVar4 = QtPrivateLogging::lcSsl();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar4->name;
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::warning(local_48,"No TLS backend is available, cannot verify DTLS client");
    }
  }
  else {
    pDVar3 = (DtlsCookieVerifier *)(**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2);
    pDVar1 = (this->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
             .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl;
    (this->backend)._M_t.
    super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
    ._M_t.
    super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
    .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl = pDVar3;
    if (pDVar1 != (DtlsCookieVerifier *)0x0) {
      (**(code **)(*(long *)pDVar1 + 8))();
      pDVar3 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
               .super__Head_base<0UL,_QTlsPrivate::DtlsCookieVerifier_*,_false>._M_head_impl;
    }
    if (pDVar3 == (DtlsCookieVerifier *)0x0) {
      pQVar4 = QtPrivateLogging::lcSsl();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_30 = pQVar4->name;
        local_48[0] = '\x02';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        QMessageLogger::warning();
        pQVar5 = QDebug::operator<<(&local_50,"The backend");
        (**(code **)(*(long *)pQVar2 + 0x90))(&QStack_68,pQVar2);
        pQVar5 = QDebug::operator<<(pQVar5,(QString *)&QStack_68);
        QDebug::operator<<(pQVar5,"does not support DTLS cookies");
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
        QDebug::~QDebug(&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate()
{
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available, cannot verify DTLS client");
        return;
    }
    backend.reset(tlsBackend->createDtlsCookieVerifier());
    if (!backend.get())
        qCWarning(lcSsl) << "The backend" << tlsBackend->backendName() << "does not support DTLS cookies";
}